

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fStencilTexturingTests.cpp
# Opt level: O3

bool deqp::gles31::Functional::anon_unknown_1::compareStencilToRed
               (TestLog *log,ConstPixelBufferAccess *stencilRef,ConstPixelBufferAccess *result)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  ostringstream *poVar3;
  undefined4 uVar4;
  int iVar5;
  ConstPixelBufferAccess *__n;
  LogImageSet *access;
  void *__buf;
  void *__buf_00;
  int y;
  char *pcVar6;
  int iVar7;
  int local_28c;
  string local_280;
  string local_260;
  ConstPixelBufferAccess *local_240;
  ConstPixelBufferAccess *local_238;
  string local_230;
  string local_210;
  LogImageSet local_1f0;
  undefined1 local_1b0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0;
  _Alloc_hider local_190;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_180 [4];
  ios_base local_138 [264];
  
  iVar7 = (stencilRef->m_size).m_data[1];
  local_240 = result;
  if (iVar7 < 1) {
    local_28c = 0;
  }
  else {
    iVar5 = (stencilRef->m_size).m_data[0];
    y = 0;
    local_28c = 0;
    do {
      if (0 < iVar5) {
        iVar7 = 0;
        do {
          iVar5 = tcu::ConstPixelBufferAccess::getPixStencil(stencilRef,iVar7,y,0);
          tcu::ConstPixelBufferAccess::getPixelInt
                    ((ConstPixelBufferAccess *)local_1b0,(int)local_240,iVar7,y);
          uVar4 = local_1b0._0_4_;
          if (iVar5 != local_1b0._0_4_) {
            if (local_28c < 10) {
              poVar3 = (ostringstream *)(local_1b0 + 8);
              local_1b0._0_8_ = log;
              std::__cxx11::ostringstream::ostringstream(poVar3);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar3,"ERROR: Expected ",0x10);
              std::ostream::operator<<(poVar3,iVar5);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,", got ",6);
              std::ostream::operator<<(poVar3,uVar4);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3," at (",5);
              std::ostream::operator<<(poVar3,iVar7);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,", ",2);
              std::ostream::operator<<(poVar3,y);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,")",1);
              tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
              std::__cxx11::ostringstream::~ostringstream(poVar3);
              std::ios_base::~ios_base(local_138);
            }
            else if (local_28c == 10) {
              local_1b0._0_8_ = log;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_1b0 + 8),"...",3)
              ;
              tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
              std::ios_base::~ios_base(local_138);
            }
            local_28c = local_28c + 1;
          }
          iVar7 = iVar7 + 1;
          iVar5 = (stencilRef->m_size).m_data[0];
        } while (iVar7 < iVar5);
        iVar7 = (stencilRef->m_size).m_data[1];
      }
      y = y + 1;
    } while (y < iVar7);
  }
  poVar3 = (ostringstream *)(local_1b0 + 8);
  local_238 = stencilRef;
  local_1b0._0_8_ = log;
  std::__cxx11::ostringstream::ostringstream(poVar3);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"Found ",6);
  std::ostream::operator<<(poVar3,local_28c);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar3," faulty pixels, comparison ",0x1b);
  pcVar6 = "FAILED!";
  if (local_28c == 0) {
    pcVar6 = "passed.";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,pcVar6,7);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar3);
  std::ios_base::~ios_base(local_138);
  paVar1 = &local_260.field_2;
  local_260._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_260,"ComparisonResult","");
  local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_280,"Image comparison result","")
  ;
  tcu::LogImageSet::LogImageSet(&local_1f0,&local_260,&local_280);
  tcu::TestLog::startImageSet
            (log,local_1f0.m_name._M_dataplus._M_p,local_1f0.m_description._M_dataplus._M_p);
  local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"Result","");
  local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"Result stencil buffer","");
  __n = local_240;
  tcu::LogImage::LogImage
            ((LogImage *)local_1b0,&local_230,&local_210,local_240,QP_IMAGE_COMPRESSION_MODE_BEST);
  tcu::LogImage::write((LogImage *)local_1b0,(int)log,__buf,(size_t)__n);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_p != local_180) {
    operator_delete(local_190._M_p,local_180[0]._M_allocated_capacity + 1);
  }
  if ((TestLog *)local_1b0._0_8_ != (TestLog *)(local_1b0 + 0x10)) {
    operator_delete((void *)local_1b0._0_8_,local_1a0._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  paVar2 = &local_280.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != &local_230.field_2) {
    operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0.m_description._M_dataplus._M_p != &local_1f0.m_description.field_2) {
    operator_delete(local_1f0.m_description._M_dataplus._M_p,
                    local_1f0.m_description.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0.m_name._M_dataplus._M_p != &local_1f0.m_name.field_2) {
    operator_delete(local_1f0.m_name._M_dataplus._M_p,
                    local_1f0.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._M_dataplus._M_p != paVar2) {
    operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_260._M_dataplus._M_p != paVar1) {
    operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
  }
  if (0 < local_28c) {
    local_260._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_260,"Reference","");
    local_280._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_280,"Reference stencil buffer","");
    local_230._M_dataplus._M_p = (pointer)0x1e00000000;
    tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
              ((ConstPixelBufferAccess *)&local_1f0,(TextureFormat *)&local_230,&local_238->m_size,
               &local_238->m_pitch,local_238->m_data);
    access = &local_1f0;
    tcu::LogImage::LogImage
              ((LogImage *)local_1b0,&local_260,&local_280,(ConstPixelBufferAccess *)access,
               QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write((LogImage *)local_1b0,(int)log,__buf_00,(size_t)access);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190._M_p != local_180) {
      operator_delete(local_190._M_p,local_180[0]._M_allocated_capacity + 1);
    }
    if ((TestLog *)local_1b0._0_8_ != (TestLog *)(local_1b0 + 0x10)) {
      operator_delete((void *)local_1b0._0_8_,local_1a0._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280._M_dataplus._M_p != paVar2) {
      operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_260._M_dataplus._M_p != paVar1) {
      operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
    }
  }
  tcu::TestLog::endImageSet(log);
  return local_28c == 0;
}

Assistant:

static bool compareStencilToRed (tcu::TestLog& log, const tcu::ConstPixelBufferAccess& stencilRef, const tcu::ConstPixelBufferAccess& result)
{
	const int		maxPrints		= 10;
	int				numFailed		= 0;

	DE_ASSERT(stencilRef.getFormat().order == TextureFormat::S);
	DE_ASSERT(stencilRef.getWidth() == result.getWidth() && stencilRef.getHeight() == result.getHeight());

	for (int y = 0; y < stencilRef.getHeight(); y++)
	{
		for (int x = 0; x < stencilRef.getWidth(); x++)
		{
			const int		ref		= stencilRef.getPixStencil(x, y);
			const int		res		= result.getPixelInt(x, y).x();

			if (ref != res)
			{
				if (numFailed < maxPrints)
					log << TestLog::Message << "ERROR: Expected " << ref << ", got " << res << " at (" << x << ", " << y << ")" << TestLog::EndMessage;
				else if (numFailed == maxPrints)
					log << TestLog::Message << "..." << TestLog::EndMessage;

				numFailed += 1;
			}
		}
	}

	log << TestLog::Message << "Found " << numFailed << " faulty pixels, comparison " << (numFailed == 0 ? "passed." : "FAILED!") << TestLog::EndMessage;

	log << TestLog::ImageSet("ComparisonResult", "Image comparison result")
		<< TestLog::Image("Result", "Result stencil buffer", result);

	if (numFailed > 0)
		log << TestLog::Image("Reference", "Reference stencil buffer", stencilToRedAccess(stencilRef));

	log << TestLog::EndImageSet;

	return numFailed == 0;
}